

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O0

uint64_t __thiscall axl::sys::Time::getTimestampImpl(Time *this,bool isLocal,int timeZone)

{
  int iVar1;
  int in_EDX;
  byte in_SIL;
  ushort *in_RDI;
  time64_t posixTime;
  tm tmStruct;
  uint64_t timestamp;
  long local_68;
  tm local_50;
  undefined8 local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = 0;
  local_10 = in_EDX;
  memset(&local_50,0,0x38);
  local_50.tm_year = *in_RDI - 0x76c;
  local_50.tm_mon = (int)in_RDI[1];
  local_50.tm_mday = (int)in_RDI[2];
  local_50.tm_hour = (int)in_RDI[4];
  local_50.tm_min = (int)in_RDI[5];
  local_50.tm_sec = (int)in_RDI[6];
  if ((local_9 & 1) == 0) {
    local_68 = timegm(&local_50);
    iVar1 = getTimeZoneOffsetInMinutes(local_10);
    local_68 = local_68 + iVar1 * 0x3c;
  }
  else {
    local_68 = mktime(&local_50);
  }
  return (local_68 + 0x2b6109100) * 10000000 + (long)(int)((uint)in_RDI[7] * 10000) +
         (long)(int)((uint)in_RDI[8] * 10) + (long)(int)(in_RDI[9] / 100);
}

Assistant:

uint64_t
Time::getTimestampImpl(
	bool isLocal,
	int timeZone
) const {
	uint64_t timestamp = 0;

#if (_AXL_OS_WIN)
	SYSTEMTIME sysTime = { 0 };
	sysTime.wYear   = m_year;
	sysTime.wMonth  = m_month + 1;
	sysTime.wDay    = m_monthDay;
	sysTime.wHour   = m_hour;
	sysTime.wMinute = m_minute;
	sysTime.wSecond = m_second;

	::SystemTimeToFileTime(&sysTime, (FILETIME*)&timestamp);

	if (isLocal)
		::FileTimeToLocalFileTime((const FILETIME*)&timestamp, (FILETIME*)&timestamp);
	else
		timestamp += (int64_t)getTimeZoneOffsetInMinutes(timeZone) * 60 * 10000000;

#else
	tm tmStruct = { 0 };
	tmStruct.tm_year = m_year - 1900;
	tmStruct.tm_mon  = m_month;
	tmStruct.tm_mday = m_monthDay;
	tmStruct.tm_hour = m_hour;
	tmStruct.tm_min  = m_minute;
	tmStruct.tm_sec  = m_second;

	time64_t posixTime = isLocal ?
		mktime64(&tmStruct) :
		timegm64(&tmStruct) + getTimeZoneOffsetInMinutes(timeZone) * 60;

	timestamp = (uint64_t)(posixTime + AXL_SYS_EPOCH_DIFF) * 10000000;
#endif

	return
		timestamp +
		m_milliSecond * 10000 +
		m_microSecond * 10 +
		m_nanoSecond / 100;
}